

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_fma.cpp
# Opt level: O3

int ncnn::binary_op_7_13_19_29<ncnn::BinaryOp_x86_fma_functor::binary_op_div>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  undefined1 auVar1 [32];
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [16];
  ulong uVar6;
  undefined1 (*pauVar7) [32];
  uint uVar8;
  undefined1 (*pauVar9) [32];
  undefined1 (*pauVar10) [32];
  int iVar11;
  uint uVar12;
  long lVar13;
  uint uVar14;
  undefined1 auVar15 [16];
  undefined1 in_ZMM3 [64];
  undefined1 auVar17 [64];
  undefined1 auVar16 [32];
  
  uVar2 = a->c;
  uVar8 = a->h * a->w * a->d * a->elempack;
  Mat::create_like(c,a,(Allocator *)opt);
  iVar11 = -100;
  if ((c->data != (void *)0x0) && ((long)c->c * c->cstep != 0)) {
    if (0 < (int)uVar2) {
      uVar6 = 0;
      do {
        pauVar7 = (undefined1 (*) [32])(a->cstep * uVar6 * a->elemsize + (long)a->data);
        pauVar9 = (undefined1 (*) [32])(b->cstep * uVar6 * b->elemsize + (long)b->data);
        pauVar10 = (undefined1 (*) [32])(c->cstep * uVar6 * c->elemsize + (long)c->data);
        if ((int)uVar8 < 8) {
          uVar12 = 0;
        }
        else {
          iVar11 = 7;
          do {
            auVar1 = *pauVar7;
            auVar4 = vrcpps_avx(*pauVar9);
            auVar17._0_4_ = auVar1._0_4_ * auVar4._0_4_;
            auVar17._4_4_ = auVar1._4_4_ * auVar4._4_4_;
            auVar17._8_4_ = auVar1._8_4_ * auVar4._8_4_;
            auVar17._12_4_ = auVar1._12_4_ * auVar4._12_4_;
            auVar17._16_4_ = auVar1._16_4_ * auVar4._16_4_;
            auVar17._20_4_ = auVar1._20_4_ * auVar4._20_4_;
            auVar17._28_36_ = in_ZMM3._28_36_;
            auVar17._24_4_ = auVar1._24_4_ * auVar4._24_4_;
            auVar16 = auVar17._0_32_;
            in_ZMM3 = ZEXT3264(auVar16);
            auVar5 = vfmsub213ps_fma(*pauVar9,auVar16,auVar1);
            auVar5 = vfnmadd213ps_fma(ZEXT1632(auVar5),auVar4,auVar16);
            *pauVar10 = ZEXT1632(auVar5);
            pauVar7 = pauVar7 + 1;
            pauVar9 = pauVar9 + 1;
            pauVar10 = pauVar10 + 1;
            iVar11 = iVar11 + 8;
            uVar12 = uVar8 & 0xfffffff8;
          } while (iVar11 < (int)uVar8);
        }
        uVar14 = uVar12 | 3;
        while ((int)uVar14 < (int)uVar8) {
          auVar5 = *(undefined1 (*) [16])*pauVar7;
          auVar3 = vrcpps_avx(*(undefined1 (*) [16])*pauVar9);
          auVar15._0_4_ = auVar5._0_4_ * auVar3._0_4_;
          auVar15._4_4_ = auVar5._4_4_ * auVar3._4_4_;
          auVar15._8_4_ = auVar5._8_4_ * auVar3._8_4_;
          auVar15._12_4_ = auVar5._12_4_ * auVar3._12_4_;
          in_ZMM3 = ZEXT1664(auVar15);
          auVar5 = vfmsub213ps_fma(*(undefined1 (*) [16])*pauVar9,auVar15,auVar5);
          auVar5 = vfnmadd213ps_fma(auVar5,auVar3,auVar15);
          *(undefined1 (*) [16])*pauVar10 = auVar5;
          pauVar7 = (undefined1 (*) [32])(*pauVar7 + 0x10);
          pauVar9 = (undefined1 (*) [32])(*pauVar9 + 0x10);
          pauVar10 = (undefined1 (*) [32])((long)*pauVar10 + 0x10);
          uVar14 = uVar12 + 7;
          uVar12 = uVar12 + 4;
        }
        if (uVar8 - uVar12 != 0 && (int)uVar12 <= (int)uVar8) {
          lVar13 = 0;
          do {
            *(float *)((long)*pauVar10 + lVar13 * 4) =
                 *(float *)(*pauVar7 + lVar13 * 4) / *(float *)(*pauVar9 + lVar13 * 4);
            lVar13 = lVar13 + 1;
          } while (uVar8 - uVar12 != (int)lVar13);
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 != uVar2);
    }
    iVar11 = 0;
  }
  return iVar11;
}

Assistant:

static int binary_op_7_13_19_29(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    // type 7 13 19 29
    c.create_like(a, opt.blob_allocator);
    if (c.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        const float* ptr1 = b.channel(q);
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _p1 = _mm512_loadu_ps(ptr1);
            __m512 _outp = op.func_pack16(_p, _p1);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _p1 = _mm256_loadu_ps(ptr1);
            __m256 _outp = op.func_pack8(_p, _p1);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _p1 = _mm_load_ps(ptr1);
            __m128 _outp = op.func_pack4(_p, _p1);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            ptr1 += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(*ptr, *ptr1);
            ptr += 1;
            ptr1 += 1;
            outptr += 1;
        }
    }

    return 0;
}